

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::EraseActiveScriptPubKeyMan(WalletBatch *this,uint8_t type,bool internal)

{
  byte bVar1;
  undefined1 in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  WalletBatch *this_00;
  undefined7 in_stack_ffffffffffffff98;
  WalletBatch local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_28;
  std::__cxx11::string::string
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (CONCAT17(in_DL,in_stack_ffffffffffffff98) & 0x1ffffffffffffff));
  std::make_pair<std::__cxx11::string_const&,unsigned_char&>
            (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58);
  bVar1 = EraseIC<std::pair<std::__cxx11::string,unsigned_char>>
                    (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
                              *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  ::~pair(in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(&in_stack_ffffffffffffff58->first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseActiveScriptPubKeyMan(uint8_t type, bool internal)
{
    const std::string key{internal ? DBKeys::ACTIVEINTERNALSPK : DBKeys::ACTIVEEXTERNALSPK};
    return EraseIC(make_pair(key, type));
}